

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void __thiscall FIX::double_conversion::StringBuilder::TrimTrailingZeros(StringBuilder *this)

{
  char *pcVar1;
  int iVar2;
  int dot_pos;
  int index;
  int iVar3;
  int n;
  
  iVar2 = this->position_;
  if ((iVar2 < 0) || ((this->buffer_).length_ <= iVar2)) {
    __assert_fail("!is_finalized() && position_ < buffer_.length()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                  ,0x120,"void FIX::double_conversion::StringBuilder::TrimTrailingZeros()");
  }
  index = 0;
LAB_0017d732:
  if (iVar2 <= index) {
    return;
  }
  pcVar1 = Vector<char>::operator[](&this->buffer_,index);
  if (*pcVar1 == '.') {
    iVar2 = this->position_;
    do {
      iVar2 = iVar2 + -1;
      if (iVar2 <= index) {
        iVar3 = this->position_;
        n = 0;
        goto LAB_0017d793;
      }
      pcVar1 = Vector<char>::operator[](&this->buffer_,iVar2);
      if (*pcVar1 == 'e') break;
      pcVar1 = Vector<char>::operator[](&this->buffer_,iVar2);
    } while (*pcVar1 != 'E');
    n = this->position_ - iVar2;
    this->position_ = iVar2;
    iVar3 = iVar2;
LAB_0017d793:
    do {
      if (iVar3 < 1) goto LAB_0017d7c6;
      pcVar1 = Vector<char>::operator[](&this->buffer_,iVar3 + -1);
      iVar3 = this->position_;
      if (*pcVar1 != '0') {
        if (0 < iVar3) {
          pcVar1 = Vector<char>::operator[](&this->buffer_,iVar3 + -1);
          if (*pcVar1 == '.') {
            this->position_ = this->position_ + -1;
          }
        }
        goto LAB_0017d7c6;
      }
      iVar3 = iVar3 + -1;
      this->position_ = iVar3;
    } while( true );
  }
  goto LAB_0017d7e4;
LAB_0017d7c6:
  if (0 < n) {
    pcVar1 = Vector<char>::operator[](&this->buffer_,iVar2);
    AddSubstring(this,pcVar1,n);
  }
LAB_0017d7e4:
  index = index + 1;
  iVar2 = this->position_;
  goto LAB_0017d732;
}

Assistant:

bool is_finalized() const { return position_ < 0; }